

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O1

UINT32 DecodeP(SCRATCH_DATA *Sd)

{
  ushort uVar1;
  UINT32 UVar2;
  uint uVar3;
  UINT16 *pUVar4;
  
  uVar1 = Sd->mPTTable[Sd->mBitBuf >> 0x18];
  if (0x1e < uVar1) {
    uVar3 = 0x800000;
    do {
      pUVar4 = Sd->mRight;
      if ((uVar3 & Sd->mBitBuf) == 0) {
        pUVar4 = Sd->mLeft;
      }
      uVar1 = pUVar4[uVar1];
      uVar3 = uVar3 >> 1;
    } while (0x1e < uVar1);
  }
  UVar2 = (UINT32)uVar1;
  FillBuf(Sd,(ushort)Sd->mPTLen[uVar1]);
  if (1 < uVar1) {
    UVar2 = (Sd->mBitBuf >> (0x21U - (char)uVar1 & 0x1f)) + (1 << ((byte)(uVar1 - 1) & 0x1f));
    FillBuf(Sd,uVar1 - 1);
  }
  return UVar2;
}

Assistant:

UINT32
DecodeP (
    IN  SCRATCH_DATA  *Sd
    )
{
    UINT16  Val;
    UINT32  Mask;
    UINT32  Pos;

    Val = Sd->mPTTable[Sd->mBitBuf >> (BITBUFSIZ - 8)];

    if (Val >= MAXNP) {
        Mask = 1U << (BITBUFSIZ - 1 - 8);

        do {
            if ((Sd->mBitBuf & Mask) != 0) {
                Val = Sd->mRight[Val];
            }
            else {
                Val = Sd->mLeft[Val];
            }

            Mask >>= 1;
        } while (Val >= MAXNP);
    }
    //
    // Advance what we have read
    //
    FillBuf (Sd, Sd->mPTLen[Val]);

    Pos = Val;
    if (Val > 1) {
        Pos = (UINT32)((1U << (Val - 1)) + GetBits (Sd, (UINT16)(Val - 1)));
    }

    return Pos;
}